

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

type * __thiscall
duckdb::Deserializer::Read<duckdb::vector<duckdb::PersistentRowGroupData,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  pointer pPVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  pointer this_00;
  PersistentRowGroupData local_70;
  
  (__return_storage_ptr__->
  super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>).
  super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>).
  super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>).
  super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*this->_vptr_Deserializer[8])(this);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    lVar3 = 0;
    do {
      (*this->_vptr_Deserializer[6])(this);
      PersistentRowGroupData::Deserialize(&local_70,this);
      (*this->_vptr_Deserializer[7])(this);
      ::std::vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
      ::emplace_back<duckdb::PersistentRowGroupData>
                (&__return_storage_ptr__->
                  super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                 ,&local_70);
      pPVar1 = local_70.column_data.
               super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
               .
               super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = local_70.column_data.
                     super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                     .
                     super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1;
          this_00 = this_00 + 1) {
        PersistentColumnData::~PersistentColumnData(this_00);
      }
      if (local_70.column_data.
          super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
          super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
          ._M_impl.super__Vector_impl_data._M_start != (PersistentColumnData *)0x0) {
        operator_delete(local_70.column_data.
                        super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                        .
                        super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70);
      lVar3 = lVar3 + 1;
    } while (lVar3 != CONCAT44(extraout_var,iVar2));
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}